

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  string *f2;
  reference pcVar7;
  pointer pcVar8;
  string *psVar9;
  char *pcVar10;
  ostream *poVar11;
  PolicyID id;
  bool local_c03;
  bool local_c02;
  bool local_bdb;
  bool local_b7a;
  bool local_b6a;
  bool local_b0a;
  bool local_afa;
  bool local_a9a;
  bool local_a89;
  bool local_a61;
  bool local_9d9;
  string local_9d0;
  string local_9b0;
  undefined1 local_990 [8];
  ostringstream e;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_810;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_808;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_800;
  allocator local_7f1;
  string local_7f0;
  undefined1 local_7d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  undefined1 local_7b0 [4];
  bool result_3;
  _Self local_790;
  _Self local_788;
  undefined1 local_779;
  int local_778;
  byte local_773;
  byte local_772;
  bool success;
  int fileIsNewer;
  _Self local_750;
  _Self local_748;
  undefined1 local_73a;
  allocator local_739;
  undefined1 local_738 [6];
  bool result_2;
  allocator local_711;
  string local_710;
  CompareOp local_6f0;
  byte local_6eb;
  byte local_6ea;
  allocator local_6e9;
  CompareOp op;
  byte local_6c3;
  byte local_6c2;
  allocator local_6c1;
  string local_6c0;
  byte local_69b;
  byte local_69a;
  allocator local_699;
  string local_698;
  _Self local_678;
  _Self local_670;
  allocator local_661;
  string local_660;
  allocator local_639;
  string local_638;
  bool local_611;
  int local_610;
  byte local_60b;
  byte local_60a;
  bool result_1;
  int val;
  byte local_5e3;
  byte local_5e2;
  allocator local_5e1;
  string local_5e0;
  byte local_5bb;
  byte local_5ba;
  allocator local_5b9;
  string local_5b8;
  _Self local_598;
  _Self local_590;
  allocator local_581;
  string local_580;
  allocator local_559;
  string local_558;
  bool local_531;
  double dStack_530;
  bool result;
  double rhs;
  double lhs;
  string local_518;
  byte local_4f3;
  byte local_4f2;
  allocator local_4f1;
  string local_4f0;
  byte local_4cb;
  byte local_4ca;
  allocator local_4c9;
  string local_4c8;
  _Self local_4a8;
  _Self local_4a0;
  _List_node_base *local_498;
  const_iterator local_490;
  allocator local_481;
  string local_480;
  cmExpandedCommandArgument local_460;
  byte local_433;
  byte local_432;
  allocator local_431;
  string local_430;
  _Self local_410;
  _List_node_base *local_408;
  const_iterator local_400;
  _List_node_base *local_3f8;
  const_iterator local_3f0;
  allocator local_3e1;
  string local_3e0;
  cmExpandedCommandArgument local_3c0;
  allocator local_391;
  string local_390;
  cmExpandedCommandArgument local_370;
  int local_344;
  string local_340 [32];
  undefined1 local_320 [8];
  ostringstream error;
  undefined1 local_1a8 [8];
  RegularExpression regEntry;
  char *rex;
  allocator local_b9;
  string local_b8;
  _Self local_98;
  _Self local_90;
  _Self local_88;
  _List_iterator<cmExpandedCommandArgument> local_80;
  iterator argP2;
  iterator argP1;
  iterator arg;
  char *def2;
  char *def;
  string def_buf;
  int reducible;
  MessageType *status_local;
  string *errorString_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  std::__cxx11::string::string((string *)&def);
  do {
    def_buf.field_2._12_4_ = 0;
    argP1 = std::__cxx11::
            list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::begin
                      (newArgs);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&argP2);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&local_80);
    while( true ) {
      local_88._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar3 = std::operator!=(&argP1,&local_88);
      if (!bVar3) break;
      argP2 = argP1;
      IncrementArguments(this,newArgs,&argP2,&local_80);
      local_90._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar4 = std::operator!=(&argP2,&local_90);
      bVar2 = false;
      bVar3 = false;
      local_9d9 = false;
      if (bVar4) {
        local_98._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        bVar4 = std::operator!=(&local_80,&local_98);
        local_9d9 = false;
        if (bVar4) {
          std::allocator<char>::allocator();
          bVar2 = true;
          std::__cxx11::string::string((string *)&local_b8,"MATCHES",&local_b9);
          bVar3 = true;
          pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          local_9d9 = IsKeyword(this,&local_b8,pcVar7);
        }
      }
      if (bVar3) {
        std::__cxx11::string::~string((string *)&local_b8);
      }
      if (bVar2) {
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      }
      if (local_9d9 != false) {
        pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        pcVar10 = GetVariableOrString(this,pcVar7);
        def2 = pcVar10;
        pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP1);
        pcVar6 = cmExpandedCommandArgument::c_str(pcVar8);
        if (pcVar10 != pcVar6) {
          pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP1);
          psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar8);
          bVar3 = cmHasLiteralPrefix<std::__cxx11::string,13ul>
                            (psVar9,(char (*) [13])"CMAKE_MATCH_");
          if (bVar3) {
            std::__cxx11::string::operator=((string *)&def,def2);
            def2 = (char *)std::__cxx11::string::c_str();
          }
        }
        pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&local_80);
        regEntry.searchstring = cmExpandedCommandArgument::c_str(pcVar8);
        cmMakefile::ClearMatches(this->Makefile);
        cmsys::RegularExpression::RegularExpression((RegularExpression *)local_1a8);
        bVar3 = cmsys::RegularExpression::compile
                          ((RegularExpression *)local_1a8,regEntry.searchstring);
        if (bVar3) {
          bVar3 = cmsys::RegularExpression::find((RegularExpression *)local_1a8,def2);
          if (bVar3) {
            cmMakefile::StoreMatches(this->Makefile,(RegularExpression *)local_1a8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_390,"1",&local_391);
            cmExpandedCommandArgument::cmExpandedCommandArgument(&local_370,&local_390,true);
            pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
            cmExpandedCommandArgument::operator=(pcVar7,&local_370);
            cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_370);
            std::__cxx11::string::~string((string *)&local_390);
            std::allocator<char>::~allocator((allocator<char> *)&local_391);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_3e0,"0",&local_3e1);
            cmExpandedCommandArgument::cmExpandedCommandArgument(&local_3c0,&local_3e0,true);
            pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
            cmExpandedCommandArgument::operator=(pcVar7,&local_3c0);
            cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_3c0);
            std::__cxx11::string::~string((string *)&local_3e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
          }
          std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                    (&local_3f0,&local_80);
          local_3f8 = (_List_node_base *)
                      std::__cxx11::
                      list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                      erase(newArgs,local_3f0);
          std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                    (&local_400,&argP2);
          local_408 = (_List_node_base *)
                      std::__cxx11::
                      list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                      erase(newArgs,local_400);
          argP2 = argP1;
          IncrementArguments(this,newArgs,&argP2,&local_80);
          def_buf.field_2._12_4_ = 1;
          local_344 = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
          poVar11 = std::operator<<((ostream *)local_320,"Regular expression \"");
          poVar11 = std::operator<<(poVar11,regEntry.searchstring);
          std::operator<<(poVar11,"\" cannot compile");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=((string *)errorString,local_340);
          std::__cxx11::string::~string(local_340);
          *status = FATAL_ERROR;
          this_local._7_1_ = 0;
          local_344 = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        }
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_1a8);
        if (local_344 != 0) goto LAB_00530fcc;
      }
      local_410._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar3 = std::operator!=(&argP2,&local_410);
      local_432 = 0;
      local_433 = 0;
      local_a61 = false;
      if (bVar3) {
        std::allocator<char>::allocator();
        local_432 = 1;
        std::__cxx11::string::string((string *)&local_430,"MATCHES",&local_431);
        local_433 = 1;
        pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        local_a61 = IsKeyword(this,&local_430,pcVar7);
      }
      if ((local_433 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_430);
      }
      if ((local_432 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_431);
      }
      if (local_a61 != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_480,"0",&local_481);
        cmExpandedCommandArgument::cmExpandedCommandArgument(&local_460,&local_480,true);
        pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        cmExpandedCommandArgument::operator=(pcVar7,&local_460);
        cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_460);
        std::__cxx11::string::~string((string *)&local_480);
        std::allocator<char>::~allocator((allocator<char> *)&local_481);
        std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                  (&local_490,&argP2);
        local_498 = (_List_node_base *)
                    std::__cxx11::
                    list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                    erase(newArgs,local_490);
        argP2 = argP1;
        IncrementArguments(this,newArgs,&argP2,&local_80);
        def_buf.field_2._12_4_ = 1;
      }
      local_4a0._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar3 = std::operator!=(&argP2,&local_4a0);
      local_4ca = 0;
      local_4cb = 0;
      local_4f2 = 0;
      local_4f3 = 0;
      lhs._6_1_ = 0;
      lhs._5_1_ = 0;
      local_a89 = false;
      if (bVar3) {
        local_4a8._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        bVar3 = std::operator!=(&local_80,&local_4a8);
        local_a89 = false;
        if (bVar3) {
          std::allocator<char>::allocator();
          local_4ca = 1;
          std::__cxx11::string::string((string *)&local_4c8,"LESS",&local_4c9);
          local_4cb = 1;
          pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          bVar3 = IsKeyword(this,&local_4c8,pcVar7);
          local_a9a = true;
          if (!bVar3) {
            std::allocator<char>::allocator();
            local_4f2 = 1;
            std::__cxx11::string::string((string *)&local_4f0,"GREATER",&local_4f1);
            local_4f3 = 1;
            pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
            bVar3 = IsKeyword(this,&local_4f0,pcVar7);
            local_a9a = true;
            if (!bVar3) {
              std::allocator<char>::allocator();
              lhs._6_1_ = 1;
              std::__cxx11::string::string
                        ((string *)&local_518,"EQUAL",(allocator *)((long)&lhs + 7));
              lhs._5_1_ = 1;
              pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
              local_a9a = IsKeyword(this,&local_518,pcVar7);
            }
          }
          local_a89 = local_a9a;
        }
      }
      if ((lhs._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_518);
      }
      if ((lhs._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&lhs + 7));
      }
      if ((local_4f3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_4f0);
      }
      if ((local_4f2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
      }
      if ((local_4cb & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_4c8);
      }
      if ((local_4ca & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
      }
      if (local_a89 != false) {
        pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        def2 = GetVariableOrString(this,pcVar7);
        pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_80);
        pcVar10 = GetVariableOrString(this,pcVar7);
        iVar5 = __isoc99_sscanf(def2,"%lg",&rhs);
        if ((iVar5 == 1) &&
           (iVar5 = __isoc99_sscanf(pcVar10,"%lg",&stack0xfffffffffffffad0), iVar5 == 1)) {
          pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_558,"LESS",&local_559);
          bVar3 = cmExpandedCommandArgument::operator==(pcVar7,&local_558);
          std::__cxx11::string::~string((string *)&local_558);
          std::allocator<char>::~allocator((allocator<char> *)&local_559);
          if (bVar3) {
            local_531 = rhs < dStack_530;
          }
          else {
            pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_580,"GREATER",&local_581);
            bVar3 = cmExpandedCommandArgument::operator==(pcVar7,&local_580);
            std::__cxx11::string::~string((string *)&local_580);
            std::allocator<char>::~allocator((allocator<char> *)&local_581);
            if (bVar3) {
              local_531 = dStack_530 < rhs;
            }
            else {
              local_531 = rhs == dStack_530;
            }
          }
        }
        else {
          local_531 = false;
        }
        HandleBinaryOp(this,local_531,(int *)(def_buf.field_2._M_local_buf + 0xc),&argP1,newArgs,
                       &argP2,&local_80);
      }
      local_590._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar3 = std::operator!=(&argP2,&local_590);
      local_5ba = 0;
      local_5bb = 0;
      local_5e2 = 0;
      local_5e3 = 0;
      local_60a = 0;
      local_60b = 0;
      local_afa = false;
      if (bVar3) {
        local_598._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        bVar3 = std::operator!=(&local_80,&local_598);
        local_afa = false;
        if (bVar3) {
          std::allocator<char>::allocator();
          local_5ba = 1;
          std::__cxx11::string::string((string *)&local_5b8,"STRLESS",&local_5b9);
          local_5bb = 1;
          pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          bVar3 = IsKeyword(this,&local_5b8,pcVar7);
          local_b0a = true;
          if (!bVar3) {
            std::allocator<char>::allocator();
            local_5e2 = 1;
            std::__cxx11::string::string((string *)&local_5e0,"STREQUAL",&local_5e1);
            local_5e3 = 1;
            pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
            bVar3 = IsKeyword(this,&local_5e0,pcVar7);
            local_b0a = true;
            if (!bVar3) {
              std::allocator<char>::allocator();
              local_60a = 1;
              std::__cxx11::string::string((string *)&val,"STRGREATER",(allocator *)&result_1);
              local_60b = 1;
              pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
              local_b0a = IsKeyword(this,(string *)&val,pcVar7);
            }
          }
          local_afa = local_b0a;
        }
      }
      if ((local_60b & 1) != 0) {
        std::__cxx11::string::~string((string *)&val);
      }
      if ((local_60a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&result_1);
      }
      if ((local_5e3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_5e0);
      }
      if ((local_5e2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      }
      if ((local_5bb & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_5b8);
      }
      if ((local_5ba & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
      }
      if (local_afa != false) {
        pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        def2 = GetVariableOrString(this,pcVar7);
        pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_80);
        pcVar10 = GetVariableOrString(this,pcVar7);
        local_610 = strcmp(def2,pcVar10);
        pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_638,"STRLESS",&local_639);
        bVar3 = cmExpandedCommandArgument::operator==(pcVar7,&local_638);
        std::__cxx11::string::~string((string *)&local_638);
        std::allocator<char>::~allocator((allocator<char> *)&local_639);
        if (bVar3) {
          local_611 = local_610 < 0;
        }
        else {
          pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_660,"STRGREATER",&local_661);
          bVar3 = cmExpandedCommandArgument::operator==(pcVar7,&local_660);
          std::__cxx11::string::~string((string *)&local_660);
          std::allocator<char>::~allocator((allocator<char> *)&local_661);
          if (bVar3) {
            local_611 = 0 < local_610;
          }
          else {
            local_611 = local_610 == 0;
          }
        }
        HandleBinaryOp(this,local_611,(int *)(def_buf.field_2._M_local_buf + 0xc),&argP1,newArgs,
                       &argP2,&local_80);
      }
      local_670._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar3 = std::operator!=(&argP2,&local_670);
      local_69a = 0;
      local_69b = 0;
      local_6c2 = 0;
      local_6c3 = 0;
      local_6ea = 0;
      local_6eb = 0;
      local_b6a = false;
      if (bVar3) {
        local_678._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        bVar3 = std::operator!=(&local_80,&local_678);
        local_b6a = false;
        if (bVar3) {
          std::allocator<char>::allocator();
          local_69a = 1;
          std::__cxx11::string::string((string *)&local_698,"VERSION_LESS",&local_699);
          local_69b = 1;
          pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          bVar3 = IsKeyword(this,&local_698,pcVar7);
          local_b7a = true;
          if (!bVar3) {
            std::allocator<char>::allocator();
            local_6c2 = 1;
            std::__cxx11::string::string((string *)&local_6c0,"VERSION_GREATER",&local_6c1);
            local_6c3 = 1;
            pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
            bVar3 = IsKeyword(this,&local_6c0,pcVar7);
            local_b7a = true;
            if (!bVar3) {
              std::allocator<char>::allocator();
              local_6ea = 1;
              std::__cxx11::string::string((string *)&op,"VERSION_EQUAL",&local_6e9);
              local_6eb = 1;
              pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
              local_b7a = IsKeyword(this,(string *)&op,pcVar7);
            }
          }
          local_b6a = local_b7a;
        }
      }
      if ((local_6eb & 1) != 0) {
        std::__cxx11::string::~string((string *)&op);
      }
      if ((local_6ea & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
      }
      if ((local_6c3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_6c0);
      }
      if ((local_6c2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
      }
      if ((local_69b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_698);
      }
      if ((local_69a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_699);
      }
      if (local_b6a != false) {
        pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        def2 = GetVariableOrString(this,pcVar7);
        pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_80);
        pcVar10 = GetVariableOrString(this,pcVar7);
        local_6f0 = OP_EQUAL;
        pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_710,"VERSION_LESS",&local_711);
        bVar3 = cmExpandedCommandArgument::operator==(pcVar7,&local_710);
        std::__cxx11::string::~string((string *)&local_710);
        std::allocator<char>::~allocator((allocator<char> *)&local_711);
        if (bVar3) {
          local_6f0 = OP_LESS;
        }
        else {
          pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_738,"VERSION_GREATER",&local_739);
          bVar3 = cmExpandedCommandArgument::operator==(pcVar7,(string *)local_738);
          std::__cxx11::string::~string((string *)local_738);
          std::allocator<char>::~allocator((allocator<char> *)&local_739);
          if (bVar3) {
            local_6f0 = OP_GREATER;
          }
        }
        local_73a = cmSystemTools::VersionCompare(local_6f0,def2,pcVar10);
        HandleBinaryOp(this,(bool)local_73a,(int *)(def_buf.field_2._M_local_buf + 0xc),&argP1,
                       newArgs,&argP2,&local_80);
      }
      local_748._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar3 = std::operator!=(&argP2,&local_748);
      local_772 = 0;
      local_773 = 0;
      local_bdb = false;
      if (bVar3) {
        local_750._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        bVar3 = std::operator!=(&local_80,&local_750);
        local_bdb = false;
        if (bVar3) {
          std::allocator<char>::allocator();
          local_772 = 1;
          std::__cxx11::string::string((string *)&fileIsNewer,"IS_NEWER_THAN",(allocator *)&success)
          ;
          local_773 = 1;
          pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          local_bdb = IsKeyword(this,(string *)&fileIsNewer,pcVar7);
        }
      }
      if ((local_773 & 1) != 0) {
        std::__cxx11::string::~string((string *)&fileIsNewer);
      }
      if ((local_772 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&success);
      }
      if (local_bdb != false) {
        local_778 = 0;
        pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP1);
        psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar8);
        pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&local_80);
        f2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar8);
        local_779 = cmsys::SystemTools::FileTimeCompare(psVar9,f2,&local_778);
        local_c02 = true;
        if (((bool)local_779) && (local_c02 = true, local_778 != 1)) {
          local_c02 = local_778 == 0;
        }
        HandleBinaryOp(this,local_c02,(int *)(def_buf.field_2._M_local_buf + 0xc),&argP1,newArgs,
                       &argP2,&local_80);
      }
      local_788._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar3 = std::operator!=(&argP2,&local_788);
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      local_c03 = false;
      if (bVar3) {
        local_790._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        bVar3 = std::operator!=(&local_80,&local_790);
        local_c03 = false;
        if (bVar3) {
          std::allocator<char>::allocator();
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          std::__cxx11::string::string
                    ((string *)local_7b0,"IN_LIST",
                     (allocator *)
                     ((long)&list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
          pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          local_c03 = IsKeyword(this,(string *)local_7b0,pcVar7);
        }
      }
      if ((list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)local_7b0);
      }
      if ((list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&list.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      if (local_c03 != false) {
        if ((this->Policy57Status == OLD) || (this->Policy57Status == WARN)) {
          if (this->Policy57Status == WARN) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_990);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_9b0,(cmPolicies *)0x39,id);
            poVar11 = std::operator<<((ostream *)local_990,(string *)&local_9b0);
            std::operator<<(poVar11,"\n");
            std::__cxx11::string::~string((string *)&local_9b0);
            std::operator<<((ostream *)local_990,
                            "IN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                           );
            pcVar1 = this->Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_9d0,false);
            std::__cxx11::string::~string((string *)&local_9d0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_990);
          }
        }
        else {
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
          pcVar7 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
          def2 = GetVariableOrString(this,pcVar7);
          pcVar1 = this->Makefile;
          pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&local_80);
          psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar8);
          pcVar10 = cmMakefile::GetDefinition(pcVar1,psVar9);
          if (pcVar10 != (char *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_7d0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_7f0,pcVar10,&local_7f1);
            cmSystemTools::ExpandListArgument
                      (&local_7f0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_7d0,true);
            std::__cxx11::string::~string((string *)&local_7f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
            local_808._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_7d0);
            local_810 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_7d0);
            local_800 = std::
                        find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char_const*>
                                  (local_808,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_810,&def2);
            local_818._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_7d0);
            list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ =
                 __gnu_cxx::operator!=(&local_800,&local_818);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_7d0);
          }
          HandleBinaryOp(this,(bool)(list.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ & 1),
                         (int *)(def_buf.field_2._M_local_buf + 0xc),&argP1,newArgs,&argP2,&local_80
                        );
        }
      }
      std::_List_iterator<cmExpandedCommandArgument>::operator++(&argP1);
    }
  } while (def_buf.field_2._12_4_ != 0);
  this_local._7_1_ = 1;
  local_344 = 1;
LAB_00530fcc:
  std::__cxx11::string::~string((string *)&def);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  std::string def_buf;
  const char *def;
  const char *def2;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      this->IncrementArguments(newArgs,argP1,argP2);
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        IsKeyword("MATCHES", *argP1))
        {
        def = this->GetVariableOrString(*arg);
        if (def != arg->c_str() // yes, we compare the pointer value
            && cmHasLiteralPrefix(arg->GetValue(), "CMAKE_MATCH_"))
          {
          // The string to match is owned by our match result variables.
          // Move it to our own buffer before clearing them.
          def_buf = def;
          def = def_buf.c_str();
          }
        const char* rex = argP2->c_str();
        this->Makefile.ClearMatches();
        cmsys::RegularExpression regEntry;
        if ( !regEntry.compile(rex) )
          {
          std::ostringstream error;
          error << "Regular expression \"" << rex << "\" cannot compile";
          errorString = error.str();
          status = cmake::FATAL_ERROR;
          return false;
          }
        if (regEntry.find(def))
          {
          this->Makefile.StoreMatches(regEntry);
          *arg = cmExpandedCommandArgument("1", true);
          }
        else
          {
          *arg = cmExpandedCommandArgument("0", true);
          }
        newArgs.erase(argP2);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs,argP1,argP2);
        reducible = 1;
        }

      if (argP1 != newArgs.end() && this->IsKeyword("MATCHES", *arg))
        {
        *arg = cmExpandedCommandArgument("0", true);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs,argP1,argP2);
        reducible = 1;
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("LESS", *argP1) ||
         this->IsKeyword("GREATER", *argP1) ||
         this->IsKeyword("EQUAL", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        double lhs;
        double rhs;
        bool result;
        if(sscanf(def, "%lg", &lhs) != 1 ||
           sscanf(def2, "%lg", &rhs) != 1)
          {
          result = false;
          }
        else if (*(argP1) == "LESS")
          {
          result = (lhs < rhs);
          }
        else if (*(argP1) == "GREATER")
          {
          result = (lhs > rhs);
          }
        else
          {
          result = (lhs == rhs);
          }
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("STRLESS", *argP1) ||
         this->IsKeyword("STREQUAL", *argP1) ||
         this->IsKeyword("STRGREATER", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        int val = strcmp(def,def2);
        bool result;
        if (*(argP1) == "STRLESS")
          {
          result = (val < 0);
          }
        else if (*(argP1) == "STRGREATER")
          {
          result = (val > 0);
          }
        else // strequal
          {
          result = (val == 0);
          }
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("VERSION_LESS", *argP1) ||
         this->IsKeyword("VERSION_GREATER", *argP1) ||
         this->IsKeyword("VERSION_EQUAL", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        cmSystemTools::CompareOp op = cmSystemTools::OP_EQUAL;
        if(*argP1 == "VERSION_LESS")
          {
          op = cmSystemTools::OP_LESS;
          }
        else if(*argP1 == "VERSION_GREATER")
          {
          op = cmSystemTools::OP_GREATER;
          }
        bool result = cmSystemTools::VersionCompare(op, def, def2);
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      // is file A newer than file B
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword("IS_NEWER_THAN", *argP1))
        {
        int fileIsNewer=0;
        bool success=cmSystemTools::FileTimeCompare(arg->GetValue(),
            (argP2)->GetValue(),
            &fileIsNewer);
        this->HandleBinaryOp(
          (success==false || fileIsNewer==1 || fileIsNewer==0),
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword("IN_LIST", *argP1))
        {
        if(this->Policy57Status != cmPolicies::OLD &&
          this->Policy57Status != cmPolicies::WARN)
          {
          bool result = false;

          def = this->GetVariableOrString(*arg);
          def2 = this->Makefile.GetDefinition(argP2->GetValue());

          if(def2)
            {
            std::vector<std::string> list;
            cmSystemTools::ExpandListArgument(def2, list, true);

            result = std::find(list.begin(), list.end(), def) != list.end();
            }

          this->HandleBinaryOp(result,
            reducible, arg, newArgs, argP1, argP2);
          }
          else if(this->Policy57Status == cmPolicies::WARN)
            {
            std::ostringstream e;
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057) << "\n";
            e << "IN_LIST will be interpreted as an operator "
              "when the policy is set to NEW.  "
              "Since the policy is not set the OLD behavior will be used.";

            this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
            }
        }

      ++arg;
      }
    }
  while (reducible);
  return true;
}